

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::success::success(success *this,text *kind_,location *where_,text *expr_,text *note_)

{
  string local_c8 [32];
  string local_a8 [48];
  location local_78;
  string local_50 [32];
  text *local_30;
  text *note__local;
  text *expr__local;
  location *where__local;
  text *kind__local;
  success *this_local;
  
  local_30 = note_;
  note__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)kind_;
  kind__local = (text *)this;
  std::__cxx11::string::string(local_50,(string *)kind_);
  location::location(&local_78,where_);
  std::__cxx11::string::string(local_a8,(string *)expr_);
  std::__cxx11::string::string(local_c8,(string *)note_);
  message::message(&this->super_message,(text *)local_50,&local_78,(text *)local_a8,(text *)local_c8
                  );
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a8);
  location::~location(&local_78);
  std::__cxx11::string::~string(local_50);
  *(undefined ***)&this->super_message = &PTR__success_0018cc38;
  return;
}

Assistant:

success( text kind_, location where_, text expr_, text note_ = "" )
    : message( kind_, where_, expr_, note_) {}